

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall detail::reader::operator()(reader *this,string *val)

{
  ushort uVar1;
  ushort *puVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar2 = (ushort *)(this->buf_).data_;
  uVar3 = (this->buf_).size_;
  uVar1 = *puVar2;
  uVar4 = 2;
  if (uVar3 < 2) {
    uVar4 = uVar3;
  }
  pvVar5 = (void *)((long)puVar2 + uVar4);
  (this->buf_).data_ = pvVar5;
  (this->buf_).size_ = uVar3 - uVar4;
  uVar4 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pvVar5,(long)pvVar5 + uVar4);
  std::__cxx11::string::operator=((string *)val,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  uVar3 = (this->buf_).size_;
  if (uVar3 < uVar4) {
    uVar4 = uVar3;
  }
  (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar4);
  (this->buf_).size_ = uVar3 - uVar4;
  return;
}

Assistant:

void operator()(std::string& val) const {
        uint16_t length = 0;
        (*this)(length);
        val = std::string(asio::buffer_cast<char const*>(buf_), length);
        buf_ = buf_ + length;
    }